

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmsort.cpp
# Opt level: O1

void __thiscall CVmQSortData::sort(CVmQSortData *this,size_t l,size_t r)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  size_t sVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  size_t sVar9;
  int iVar10;
  uint uVar11;
  uint local_54;
  
  iVar6 = (int)r;
  do {
    if (r <= l) {
      return;
    }
    iVar1 = (int)l;
    iVar10 = iVar1 + -1;
    uVar4 = r & 0xffffffff;
    sVar3 = r;
    do {
      lVar8 = (long)iVar10;
      uVar11 = -iVar10;
      do {
        lVar8 = lVar8 + 1;
        iVar10 = iVar6;
        local_54 = iVar6 - 1;
        if (iVar6 == lVar8) goto LAB_00284f46;
        iVar10 = (**this->_vptr_CVmQSortData)(this,lVar8,sVar3);
        uVar11 = uVar11 - 1;
      } while (iVar10 < 0);
      iVar10 = -uVar11;
      local_54 = ~uVar11;
LAB_00284f46:
      lVar8 = (long)(int)uVar4;
      do {
        lVar8 = lVar8 + -1;
        if (iVar1 + 1 == (int)uVar4) {
          uVar4 = l & 0xffffffff;
          break;
        }
        iVar2 = (**this->_vptr_CVmQSortData)(this,lVar8,sVar3);
        uVar4 = (ulong)((int)uVar4 - 1);
      } while (0 < iVar2);
      sVar9 = (size_t)iVar10;
      iVar2 = (int)uVar4;
      sVar5 = (size_t)iVar2;
      (*this->_vptr_CVmQSortData[1])(this,sVar9,sVar5);
      iVar7 = (int)sVar3;
      if (iVar2 == iVar7) {
        sVar3 = sVar9;
      }
      if (iVar10 == iVar7) {
        sVar3 = sVar5;
      }
    } while (iVar10 < iVar2);
    (*this->_vptr_CVmQSortData[1])(this,sVar9,sVar5);
    (*this->_vptr_CVmQSortData[1])(this,sVar9,r);
    if (iVar1 <= (int)local_54) {
      sort(this,l,(long)(int)local_54);
    }
    if (iVar6 <= iVar10) {
      return;
    }
    l = (size_t)(int)(local_54 + 2);
  } while( true );
}

Assistant:

void CVmQSortData::sort(VMG_ size_t l, size_t r)
{
    /* proceed if we have a non-empty range */
    if (r > l)
    {
        int i, j;
        size_t v_idx = r;

        /* start at the ends of the range */
		i = (int)l - 1;
        j = r;

        /* partition the range */
        do
        {
            /* find the leftmost element >= the right element */
            do
            {
                ++i;
			} while (i != (int)r && compare(vmg_ i, v_idx) < 0);

            /* find the rightmost element <= the right element */
            do
            {
                --j;
			} while (j != (int)l && compare(vmg_ j, v_idx) > 0);

            /* exchange elements i and j */
            exchange(vmg_ i, j);

            /* if we moved the 'v' element, follow that in the index */
			if ((int)v_idx == i)
                v_idx = j;
			else if ((int)v_idx == j)
                v_idx = i;

        } while (j > i);

        /* undo the last exchange */
        exchange(vmg_ i, j);

        /* exchange the right value into the pivot point */
        exchange(vmg_ i, r);

        /* recursively sort the subranges */
		if (i > (int)l)
            sort(vmg_ l, i - 1);
		if (i < (int)r)
            sort(vmg_ i + 1, r);
    }
}